

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<3,_13,_13>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  ShaderEvalContext *extraout_RDX;
  ShaderEvalContext *extraout_RDX_00;
  ShaderEvalContext *evalCtx_00;
  Type in1;
  Type in0;
  MatrixCaseUtils local_104 [12];
  Mat4 local_f8;
  Mat4 local_b8;
  VecAccess<float,_4,_3> local_78;
  Matrix<float,_4,_4> local_60;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,13>
              (&local_b8,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    evalCtx_00 = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_4,_4>::Matrix(&local_b8,(float *)sr::(anonymous_namespace)::s_constInMat4x4);
    evalCtx_00 = extraout_RDX_00;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,13>
              (&local_f8,(MatrixCaseUtils *)evalCtx,evalCtx_00,in_ECX);
  }
  else {
    tcu::Matrix<float,_4,_4>::Matrix
              (&local_f8,(float *)(sr::(anonymous_namespace)::s_constInMat4x4 + 0x40));
  }
  tcu::operator/(&local_60,&local_b8,&local_f8);
  reduceToVec3(local_104,&local_60);
  local_78.m_vector = &evalCtx->color;
  local_78.m_index[0] = 0;
  local_78.m_index[1] = 1;
  local_78.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_78,(Vector<float,_3> *)local_104);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}